

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O0

void Imf_3_2::loadDeepScanLineImage(string *fileName,Header *hdr,DeepImage *img)

{
  _Base_ptr p_Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  string *psVar6;
  DeepImageChannel *pDVar7;
  Box2i *pBVar8;
  Attribute *pAVar9;
  _Base_ptr in_RDX;
  _Base_ptr in_RSI;
  ConstIterator i_2;
  Edit edit;
  ConstIterator i_1;
  DeepFrameBuffer fb;
  DeepImageLevel *level;
  ConstIterator i;
  ChannelList *cl;
  DeepScanLineInputFile in;
  DeepImageLevel *in_stack_fffffffffffffd38;
  Image *in_stack_fffffffffffffd40;
  Image *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  allocator<char> *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  SampleCountChannel *in_stack_fffffffffffffd80;
  undefined1 local_178 [56];
  iterator local_140;
  iterator local_130;
  Slice local_e8 [104];
  DeepImageLevel *local_80;
  allocator<char> local_71;
  string local_70 [32];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_30;
  _Base_ptr local_18;
  _Base_ptr local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)&stack0xffffffffffffffd8,pcVar4,iVar3);
  Imf_3_2::DeepScanLineInputFile::header();
  local_30 = Imf_3_2::Header::channels();
  Image::clearChannels(in_stack_fffffffffffffd50);
  local_48 = Imf_3_2::ChannelList::begin();
  while( true ) {
    local_50 = Imf_3_2::ChannelList::end();
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffd40,
                       (ConstIterator *)in_stack_fffffffffffffd38);
    p_Var1 = local_18;
    if (!bVar2) break;
    ChannelList::ConstIterator::name((ConstIterator *)0x1265de);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    ChannelList::ConstIterator::channel((ConstIterator *)0x126629);
    Image::insertChannel
              (in_stack_fffffffffffffd40,(string *)in_stack_fffffffffffffd38,(Channel *)0x126650);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffd40);
  }
  Imf_3_2::DeepScanLineInputFile::header();
  uVar5 = Imf_3_2::Header::dataWindow();
  (**(code **)(*(long *)p_Var1 + 0x10))(p_Var1,uVar5,0);
  local_80 = (DeepImageLevel *)(**(code **)(*(long *)local_18 + 0x18))(local_18,0);
  DeepFrameBuffer::DeepFrameBuffer
            ((DeepFrameBuffer *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  DeepImageLevel::sampleCounts(local_80);
  SampleCountChannel::slice(in_stack_fffffffffffffd80);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_e8);
  local_130._M_node = (_Base_ptr)DeepImageLevel::begin(in_stack_fffffffffffffd38);
  DeepImageLevel::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_fffffffffffffd40,(Iterator *)in_stack_fffffffffffffd38);
  while( true ) {
    local_140._M_node = (_Base_ptr)DeepImageLevel::end(in_stack_fffffffffffffd38);
    DeepImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)in_stack_fffffffffffffd40,(Iterator *)in_stack_fffffffffffffd38);
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffd40,
                       (ConstIterator *)in_stack_fffffffffffffd38);
    if (!bVar2) break;
    psVar6 = DeepImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x126879);
    pDVar7 = DeepImageLevel::ConstIterator::channel((ConstIterator *)0x126890);
    (*(pDVar7->super_ImageChannel)._vptr_ImageChannel[4])(local_178);
    Imf_3_2::DeepFrameBuffer::insert((string *)local_e8,(DeepSlice *)psVar6);
    DeepImageLevel::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffd40);
  }
  Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&stack0xffffffffffffffd8);
  DeepImageLevel::sampleCounts(local_80);
  SampleCountChannel::Edit::Edit
            ((Edit *)in_stack_fffffffffffffd40,(SampleCountChannel *)in_stack_fffffffffffffd38);
  pBVar8 = ImageLevel::dataWindow(&local_80->super_ImageLevel);
  iVar3 = (pBVar8->min).y;
  ImageLevel::dataWindow(&local_80->super_ImageLevel);
  Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&stack0xffffffffffffffd8,iVar3);
  SampleCountChannel::Edit::~Edit((Edit *)0x1269a4);
  pBVar8 = ImageLevel::dataWindow(&local_80->super_ImageLevel);
  iVar3 = (pBVar8->min).y;
  ImageLevel::dataWindow(&local_80->super_ImageLevel);
  Imf_3_2::DeepScanLineInputFile::readPixels((int)&stack0xffffffffffffffd8,iVar3);
  Imf_3_2::DeepScanLineInputFile::header();
  Imf_3_2::Header::begin();
  while( true ) {
    Imf_3_2::DeepScanLineInputFile::header();
    Imf_3_2::Header::end();
    bVar2 = operator!=((ConstIterator *)in_stack_fffffffffffffd40,
                       (ConstIterator *)in_stack_fffffffffffffd38);
    if (!bVar2) break;
    pcVar4 = Header::ConstIterator::name((ConstIterator *)0x126a8c);
    iVar3 = strcmp(pcVar4,"tiles");
    p_Var1 = local_10;
    if (iVar3 != 0) {
      pAVar9 = (Attribute *)Header::ConstIterator::name((ConstIterator *)0x126ac3);
      in_stack_fffffffffffffd40 =
           (Image *)Header::ConstIterator::attribute((ConstIterator *)0x126ad7);
      Imf_3_2::Header::insert((char *)p_Var1,pAVar9);
    }
    Header::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffd40);
  }
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x126b3c);
  Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile
            ((DeepScanLineInputFile *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void
loadDeepScanLineImage (const string& fileName, Header& hdr, DeepImage& img)
{
    DeepScanLineInputFile in (fileName.c_str ());

    const ChannelList& cl = in.header ().channels ();

    img.clearChannels ();

    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
        img.insertChannel (i.name (), i.channel ());

    img.resize (in.header ().dataWindow (), ONE_LEVEL, ROUND_DOWN);

    DeepImageLevel& level = img.level ();
    DeepFrameBuffer fb;

    fb.insertSampleCountSlice (level.sampleCounts ().slice ());

    for (DeepImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    in.setFrameBuffer (fb);

    {
        SampleCountChannel::Edit edit (level.sampleCounts ());

        in.readPixelSampleCounts (
            level.dataWindow ().min.y, level.dataWindow ().max.y);
    }

    in.readPixels (level.dataWindow ().min.y, level.dataWindow ().max.y);

    for (Header::ConstIterator i = in.header ().begin ();
         i != in.header ().end ();
         ++i)
    {
        if (strcmp (i.name (), "tiles")) hdr.insert (i.name (), i.attribute ());
    }
}